

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O3

void cards_reverse(Card **cards,uchar cardsCount)

{
  Card *pCVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((byte)(cardsCount - 1) != 0) {
    uVar4 = 0;
    uVar3 = (ulong)(byte)(cardsCount - 1);
    do {
      uVar2 = uVar3 - 1;
      pCVar1 = cards[uVar4];
      cards[uVar4] = cards[uVar3];
      cards[uVar3] = pCVar1;
      uVar4 = uVar4 + 1;
      uVar3 = uVar2;
    } while (uVar4 < (uVar2 & 0xff));
  }
  return;
}

Assistant:

void cards_reverse(Card ** cards, unsigned char cardsCount)
{
	unsigned char start=0;
	unsigned char end=cardsCount-1;
	Card * card;
	while(start<end)
	{
		card = cards[start];
		cards[start] = cards[end];
		cards[end] = card;
		start++;
		end--;
	}
}